

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

void bmGateWay(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int p_equivalence)

{
  size_t sVar1;
  size_t __size;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int *oGroup1;
  Vec_Int_t **oDep;
  Vec_Int_t **oDep_00;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t **ppVVar10;
  Vec_Int_t **ppVVar11;
  char *vPiValues;
  Vec_Int_t **vPiValues_00;
  int *piVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  Abc_Ntk_t *pAVar15;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t **topOrder;
  Vec_Ptr_t **topOrder_00;
  long lVar16;
  uint uVar17;
  char *pNtk_00;
  ulong uVar18;
  size_t __size_00;
  size_t sVar19;
  ulong uVar20;
  float fVar21;
  Vec_Int_t **in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffea0;
  Vec_Int_t **ppVVar22;
  int *piVar23;
  int oLastItem1;
  Abc_Ntk_t *local_100;
  Abc_Ntk_t *local_f8;
  int oLastItem2;
  int iLastItem1;
  Vec_Int_t **local_e8;
  Vec_Int_t **local_e0;
  Vec_Int_t **local_d8;
  int iLastItem2;
  int *local_c8;
  Vec_Int_t **local_c0;
  int *local_b8;
  int *local_b0;
  Vec_Int_t **local_a8;
  Abc_Ntk_t *local_a0;
  float local_98;
  undefined4 uStack_94;
  int *local_90;
  Vec_Int_t **local_88;
  Vec_Int_t **local_80;
  long local_78;
  Vec_Int_t **local_70;
  int *local_68;
  timespec ts;
  long local_38;
  
  iVar6 = clock_gettime(3,(timespec *)&ts);
  if (iVar6 < 0) {
    local_38 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_38 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  uVar17 = pNtk1->vPis->nSize;
  local_78 = (long)(int)uVar17;
  local_e0 = (Vec_Int_t **)(ulong)uVar17;
  sVar1 = (long)local_e0 * 8;
  local_98 = (float)p_equivalence;
  uStack_94 = 0;
  local_c0 = (Vec_Int_t **)malloc(sVar1);
  uVar17 = pNtk1->vPos->nSize;
  local_f8 = (Abc_Ntk_t *)(ulong)uVar17;
  sVar19 = (long)local_f8 * 8;
  local_a0 = pNtk1;
  local_70 = (Vec_Int_t **)malloc(sVar19);
  uVar2 = pNtk2->vPis->nSize;
  local_e8 = (Vec_Int_t **)(ulong)uVar2;
  local_90 = (int *)(long)(int)uVar2;
  __size = (long)local_e8 * 8;
  local_d8 = (Vec_Int_t **)malloc(__size);
  uVar2 = pNtk2->vPos->nSize;
  __size_00 = (ulong)uVar2 << 3;
  local_100 = pNtk2;
  local_80 = (Vec_Int_t **)malloc(__size_00);
  ppVVar10 = (Vec_Int_t **)malloc(sVar1);
  local_88 = (Vec_Int_t **)malloc(sVar19);
  ppVVar11 = (Vec_Int_t **)malloc(__size);
  local_a8 = (Vec_Int_t **)malloc(__size_00);
  lVar16 = local_78;
  local_68 = (int *)malloc(local_78 * 4);
  local_c8 = (int *)malloc((long)(int)uVar17 << 2);
  piVar12 = local_90;
  local_b8 = (int *)malloc((long)local_90 * 4);
  local_b0 = (int *)malloc((long)(int)uVar2 << 2);
  vPiValues = (char *)malloc(lVar16 + 1);
  vPiValues[lVar16] = '\0';
  vPiValues_00 = (Vec_Int_t **)malloc((long)piVar12 + 1);
  ppVVar22 = local_e0;
  *(char *)((long)vPiValues_00 + (long)piVar12) = '\0';
  sVar1 = (long)local_e0 * 4;
  piVar12 = (int *)malloc(sVar1);
  local_90 = (int *)malloc((long)local_e8 << 2);
  if (0 < lVar16) {
    memset(vPiValues,0x30,(size_t)ppVVar22);
    memset(vPiValues_00,0x30,(size_t)ppVVar22);
    sVar19 = 0;
    memset(piVar12,0,sVar1);
    memset(local_90,0,sVar1);
    do {
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      local_c0[sVar19] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      ppVVar10[sVar19] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      local_d8[sVar19] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      ppVVar11[sVar19] = pVVar13;
      sVar19 = sVar19 + 1;
    } while (ppVVar22 != (Vec_Int_t **)sVar19);
  }
  oDep_00 = local_70;
  oDep = local_80;
  ppVVar22 = local_88;
  local_e8 = ppVVar11;
  local_e0 = ppVVar10;
  if (0 < (int)local_f8) {
    uVar20 = 0;
    do {
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      oDep_00[uVar20] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      ppVVar22[uVar20] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      oDep[uVar20] = pVVar13;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      pVVar13->nCap = 0x10;
      pVVar13->nSize = 0;
      piVar14 = (int *)malloc(0x40);
      pVVar13->pArray = piVar14;
      local_a8[uVar20] = pVVar13;
      uVar20 = uVar20 + 1;
    } while (local_f8 != (Abc_Ntk_t *)uVar20);
  }
  pAVar15 = Abc_NtkStrash(local_a0,0,0,0);
  pNtk = Abc_NtkStrash(local_100,0,0,0);
  puts("Network  strashing is done!");
  ppVVar10 = local_c0;
  getDependencies(pAVar15,local_c0,oDep_00);
  getDependencies(pNtk,local_d8,oDep);
  puts("Getting dependencies is done!");
  fVar21 = local_98;
  local_f8 = pAVar15;
  initMatchList(pAVar15,ppVVar10,oDep_00,local_e0,&iLastItem1,ppVVar22,&oLastItem1,local_68,local_c8
                ,(int)local_98);
  local_100 = pNtk;
  initMatchList(pNtk,local_d8,oDep,local_e8,&iLastItem2,local_a8,&oLastItem2,local_b8,local_b0,
                (int)fVar21);
  puts("Initializing match lists is done!");
  iVar9 = iLastItem1;
  iVar6 = oLastItem1;
  if ((iLastItem1 == iLastItem2) && (oLastItem1 == oLastItem2)) {
    pNtk_00 = "Refining IOs by dependencies ...";
    printf("Refining IOs by dependencies ...");
    pAVar15 = local_f8;
    iVar7 = 1;
    iVar8 = 1;
    do {
      ppVVar22 = local_c0;
      if (iVar8 != 0) {
        iSortDependencies(local_f8,local_c0,local_c8);
        pNtk_00 = (char *)local_100;
        iSortDependencies(local_100,local_d8,local_b0);
      }
      piVar14 = local_68;
      if (iVar7 != 0) {
        oSortDependencies(pAVar15,local_70,local_68);
        pNtk_00 = (char *)local_100;
        oSortDependencies(local_100,local_80,local_b8);
      }
      if (iVar9 < pAVar15->vPis->nSize) {
        iSplitByDep((Abc_Ntk_t *)pNtk_00,ppVVar22,local_e0,piVar14,&iLastItem1,local_c8);
        if (iVar6 < local_f8->vPos->nSize) {
          oSplitByDep((Abc_Ntk_t *)pNtk_00,local_70,local_88,local_c8,&oLastItem1,piVar14);
        }
      }
      iVar8 = 0;
      iVar7 = 0;
      if (iVar9 < local_100->vPis->nSize) {
        iVar7 = iSplitByDep((Abc_Ntk_t *)pNtk_00,local_d8,local_e8,local_b8,&iLastItem2,local_b0);
      }
      if (iVar6 < local_100->vPos->nSize) {
        iVar8 = oSplitByDep((Abc_Ntk_t *)pNtk_00,local_80,local_a8,local_b0,&oLastItem2,local_b8);
        iVar6 = oLastItem2;
      }
      uVar17 = iLastItem1;
      if ((iLastItem1 != iLastItem2) || (oLastItem1 != iVar6)) {
        fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
        topOrder = (Vec_Ptr_t **)0x0;
        topOrder_00 = (Vec_Ptr_t **)0x0;
        goto LAB_0024904b;
      }
      iVar9 = iLastItem1;
    } while (iVar7 != 0 || iVar8 != 0);
    puts(" done!");
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    local_a0._0_4_ = (float)(lVar16 + local_38);
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      local_78 = 1;
    }
    else {
      lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      local_78 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    local_a0 = (Abc_Ntk_t *)CONCAT44(local_a0._4_4_,local_a0._0_4_ / 1e+06);
    topOrder = findTopologicalOrder(local_f8);
    topOrder_00 = findTopologicalOrder(local_100);
    printf("Refining IOs by simulation ...");
    fVar21 = 0.0;
    do {
      local_98 = fVar21;
      if (0 < (int)uVar17) {
        uVar20 = 0;
        do {
          rand();
          rand();
          iVar6 = rand();
          uVar2 = local_e0[uVar20]->nSize;
          if (uVar2 != local_e8[uVar20]->nSize) goto LAB_0024902b;
          if (0 < (int)uVar2) {
            bVar5 = (byte)iVar6 & 1 | 0x30;
            piVar14 = local_e0[uVar20]->pArray;
            piVar23 = local_e8[uVar20]->pArray;
            uVar18 = 0;
            do {
              vPiValues[piVar14[uVar18]] = bVar5;
              if (uVar2 == uVar18) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              *(byte *)((long)vPiValues_00 + (long)piVar23[uVar18]) = bVar5;
              uVar18 = uVar18 + 1;
            } while (uVar2 != uVar18);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar17);
      }
      iVar6 = refineIOBySimulation
                        (local_f8,local_e0,&iLastItem1,local_68,local_c0,local_88,&oLastItem1,
                         local_c8,local_70,vPiValues,piVar12,topOrder);
      piVar14 = &oLastItem2;
      ppVVar22 = vPiValues_00;
      piVar23 = local_90;
      iVar9 = refineIOBySimulation
                        (local_100,local_e8,&iLastItem2,local_b8,local_d8,local_a8,piVar14,local_b0,
                         local_80,(char *)vPiValues_00,local_90,topOrder_00);
      fVar21 = (float)((int)local_98 + 1);
      if (iVar9 != 0) {
        fVar21 = 0.0;
      }
      if (iVar6 == 0) {
        fVar21 = (float)((int)local_98 + 1);
      }
      uVar17 = iLastItem1;
      if (((iVar6 != iVar9) || (iLastItem1 != iLastItem2)) || (oLastItem1 != oLastItem2)) {
LAB_0024902b:
        fwrite("Input refinement by simulation finds two circuits different.\n",0x3d,1,_stdout);
        iLastItem1 = uVar17;
        goto LAB_0024904b;
      }
    } while ((int)fVar21 < 0xc9);
    puts(" done!");
    iVar6 = clock_gettime(3,(timespec *)&ts);
    ppVVar10 = local_c0;
    oGroup1 = local_c8;
    if (iVar6 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    local_98 = (float)(lVar16 + local_78) / 1e+06;
    puts("SAT-based search started ...");
    fVar21 = refineBySAT(local_f8,local_e0,local_68,ppVVar10,&iLastItem1,local_88,oGroup1,
                         in_stack_fffffffffffffe90,&oLastItem1,in_stack_fffffffffffffea0,local_100,
                         local_e8,local_b8,local_d8,piVar14,local_a8,local_b0,ppVVar22,piVar23,
                         local_90);
    local_100 = (Abc_Ntk_t *)CONCAT44(local_100._4_4_,fVar21);
    printf("Init Time = %4.2f\n",(double)local_a0._0_4_);
    printf("Simulation Time = %4.2f\n",(double)local_98);
    printf("SAT Time = %4.2f\n",(double)local_100._0_4_);
    printf("Overall Time = %4.2f\n",(double)(local_98 + local_a0._0_4_ + local_100._0_4_));
  }
  else {
    fwrite("I/O dependencies of two circuits are different.\n",0x30,1,_stdout);
    topOrder = (Vec_Ptr_t **)0x0;
    topOrder_00 = (Vec_Ptr_t **)0x0;
  }
LAB_0024904b:
  if (0 < iLastItem1) {
    uVar20 = 0;
    do {
      pVVar13 = local_e0[uVar20];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      pVVar13 = local_e8[uVar20];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      uVar20 = uVar20 + 1;
    } while ((uint)iLastItem1 != uVar20);
  }
  if (0 < (long)oLastItem1) {
    lVar16 = 0;
    do {
      pVVar13 = local_88[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      pVVar13 = local_a8[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      lVar16 = lVar16 + 1;
    } while (oLastItem1 != lVar16);
  }
  ppVVar22 = local_70;
  if (0 < local_f8->vPis->nSize) {
    lVar16 = 0;
    do {
      pVVar13 = local_c0[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      pVVar13 = local_d8[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      if (topOrder != (Vec_Ptr_t **)0x0) {
        pVVar3 = topOrder[lVar16];
        ppvVar4 = pVVar3->pArray;
        if (ppvVar4 != (void **)0x0) {
          free(ppvVar4);
        }
        free(pVVar3);
        pVVar3 = topOrder_00[lVar16];
        ppvVar4 = pVVar3->pArray;
        if (ppvVar4 != (void **)0x0) {
          free(ppvVar4);
        }
        free(pVVar3);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_f8->vPis->nSize);
  }
  if (0 < local_f8->vPos->nSize) {
    lVar16 = 0;
    do {
      pVVar13 = ppVVar22[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      pVVar13 = local_80[lVar16];
      piVar14 = pVVar13->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
      }
      free(pVVar13);
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_f8->vPos->nSize);
  }
  if (local_e0 != (Vec_Int_t **)0x0) {
    free(local_e0);
  }
  ppVVar10 = local_c0;
  if (local_e8 != (Vec_Int_t **)0x0) {
    free(local_e8);
  }
  if (local_88 != (Vec_Int_t **)0x0) {
    free(local_88);
  }
  if (local_a8 != (Vec_Int_t **)0x0) {
    free(local_a8);
  }
  if (ppVVar10 != (Vec_Int_t **)0x0) {
    free(ppVVar10);
  }
  if (local_d8 != (Vec_Int_t **)0x0) {
    free(local_d8);
  }
  if (ppVVar22 != (Vec_Int_t **)0x0) {
    free(ppVVar22);
  }
  if (local_80 != (Vec_Int_t **)0x0) {
    free(local_80);
  }
  piVar14 = local_c8;
  if (local_68 != (int *)0x0) {
    free(local_68);
  }
  if (local_b8 != (int *)0x0) {
    free(local_b8);
  }
  if (piVar14 != (int *)0x0) {
    free(piVar14);
  }
  if (local_b0 != (int *)0x0) {
    free(local_b0);
  }
  if (vPiValues != (char *)0x0) {
    free(vPiValues);
  }
  if (vPiValues_00 != (Vec_Int_t **)0x0) {
    free(vPiValues_00);
  }
  if (piVar12 != (int *)0x0) {
    free(piVar12);
  }
  if (local_90 != (int *)0x0) {
    free(local_90);
  }
  if (topOrder != (Vec_Ptr_t **)0x0) {
    free(topOrder);
    if (topOrder_00 != (Vec_Ptr_t **)0x0) {
      free(topOrder_00);
    }
  }
  return;
}

Assistant:

void bmGateWay( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int p_equivalence )
{	
	Vec_Int_t ** iDep1, ** oDep1;
	Vec_Int_t ** iDep2, ** oDep2;
	Vec_Int_t ** iMatch1, ** oMatch1;
	Vec_Int_t ** iMatch2, ** oMatch2;		
	int * iGroup1, * oGroup1;
	int * iGroup2, * oGroup2;
	int iLastItem1, oLastItem1;
	int iLastItem2, oLastItem2;	
	int i, j;	
	
	char * vPiValues1, * vPiValues2;
	int * observability1, * observability2;
	abctime clk = Abc_Clock();
	float initTime;
	float simulTime;
	float satTime;
	Vec_Ptr_t ** topOrder1 = NULL, ** topOrder2 = NULL;

	extern void getDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep);
	extern void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence);		
	extern void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup);
	extern void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup);
	extern int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup);
	extern int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup);	
	extern Vec_Ptr_t ** findTopologicalOrder(Abc_Ntk_t * pNtk);
	extern int refineIOBySimulation(Abc_Ntk_t *pNtk, Vec_Int_t** iMatch, int* iLastItem, int * iGroup, Vec_Int_t** iDep, Vec_Int_t** oMatch, int* oLastItem, int * oGroup, Vec_Int_t** oDep, char * vPiValues, int * observability, Vec_Ptr_t ** topOrder);	
	extern float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
							Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2);				
	int checkListConsistency(Vec_Int_t ** iMatch1, Vec_Int_t ** oMatch1, Vec_Int_t ** iMatch2, Vec_Int_t ** oMatch2, int iLastItem1, int oLastItem1, int iLastItem2, int oLastItem2);	

	iDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );

	iMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
	oMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

	iMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
	oMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );		

	iGroup1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
	oGroup1 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk1) );

	iGroup2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );
	oGroup2 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk2) );

	vPiValues1 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk1) + 1);
	vPiValues1[Abc_NtkPiNum(pNtk1)] = '\0';	

	vPiValues2 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk2) + 1);
	vPiValues2[Abc_NtkPiNum(pNtk2)] = '\0';	

	observability1 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk1));
	observability2 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk2));

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{		
		iDep1[i] = Vec_IntAlloc( 1 );
		iMatch1[i] = Vec_IntAlloc( 1 );

		iDep2[i] = Vec_IntAlloc( 1 );
		iMatch2[i] = Vec_IntAlloc( 1 );

		vPiValues1[i] = '0';
		vPiValues2[i] = '0';

		observability1[i] = 0;
		observability2[i] = 0;
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		oDep1[i] = Vec_IntAlloc( 1 );
		oMatch1[i] = Vec_IntAlloc( 1 );

		oDep2[i] = Vec_IntAlloc( 1 );
		oMatch2[i] = Vec_IntAlloc( 1 );
	}	
	
	/************* Strashing ************/	
	pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );	
	pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );			
	printf("Network  strashing is done!\n");	
	/************************************/	
	
	/******* Getting Dependencies *******/	
	getDependencies(pNtk1, iDep1, oDep1);
	getDependencies(pNtk2, iDep2, oDep2);			
	printf("Getting dependencies is done!\n");	
	/************************************/

	/***** Intializing match lists ******/	
	initMatchList(pNtk1, iDep1, oDep1, iMatch1, &iLastItem1, oMatch1, &oLastItem1, iGroup1, oGroup1, p_equivalence);			
	initMatchList(pNtk2, iDep2, oDep2, iMatch2, &iLastItem2, oMatch2, &oLastItem2, iGroup2, oGroup2, p_equivalence);	
	printf("Initializing match lists is done!\n");		
	/************************************/

	if( !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2) )
	{
		fprintf( stdout, "I/O dependencies of two circuits are different.\n");
		goto freeAndExit;
	}		

	printf("Refining IOs by dependencies ...");				
	// split match lists further by checking dependencies
	do
	{
		int iNumOfItemsAdded = 1, oNumOfItemsAdded = 1;		

		do
		{	
			if( oNumOfItemsAdded )
			{
				iSortDependencies(pNtk1, iDep1, oGroup1);
				iSortDependencies(pNtk2, iDep2, oGroup2);
			}
			
			if( iNumOfItemsAdded )
			{
				oSortDependencies(pNtk1, oDep1, iGroup1);
				oSortDependencies(pNtk2, oDep2, iGroup2);
			}

			if( iLastItem1 < Abc_NtkPiNum(pNtk1) )
			{				
				iSplitByDep(pNtk1, iDep1, iMatch1, iGroup1, &iLastItem1, oGroup1);
				if( oLastItem1 < Abc_NtkPoNum(pNtk1) )
					oSplitByDep(pNtk1, oDep1, oMatch1, oGroup1, &oLastItem1, iGroup1);
			}				

			if( iLastItem2 < Abc_NtkPiNum(pNtk2) )
				iNumOfItemsAdded = iSplitByDep(pNtk2, iDep2, iMatch2, iGroup2, &iLastItem2, oGroup2);
			else
				iNumOfItemsAdded = 0;	
				
			if( oLastItem2 < Abc_NtkPoNum(pNtk2) )		
				oNumOfItemsAdded = oSplitByDep(pNtk2, oDep2, oMatch2, oGroup2, &oLastItem2, iGroup2);
			else
				oNumOfItemsAdded = 0;
			
			if(!checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "I/O dependencies of two circuits are different.\n");
				goto freeAndExit;
			}		
		}while(iNumOfItemsAdded != 0 || oNumOfItemsAdded != 0);

	}while(0);

	printf(" done!\n");

	initTime = ((float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC));	
	clk = Abc_Clock();

	topOrder1 = findTopologicalOrder(pNtk1);
	topOrder2 = findTopologicalOrder(pNtk2);

	printf("Refining IOs by simulation ...");				

	do
	{
		int counter = 0;
		int ioSuccess1, ioSuccess2;	
		
		do
		{
			for(i = 0; i < iLastItem1; i++)
			{
				int temp = (int)(SIM_RANDOM_UNSIGNED % 2);		
				
				if(Vec_IntSize(iMatch1[i]) != Vec_IntSize(iMatch2[i]))
				{
					fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
					goto freeAndExit;
				}
				
				for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
				{
					vPiValues1[Vec_IntEntry(iMatch1[i], j)] = temp + '0';
					vPiValues2[Vec_IntEntry(iMatch2[i], j)] = temp + '0';	
				}			
			}					
			
			ioSuccess1 = refineIOBySimulation(pNtk1, iMatch1, &iLastItem1, iGroup1, iDep1, oMatch1, &oLastItem1, oGroup1, oDep1, vPiValues1, observability1, topOrder1);				
			ioSuccess2 = refineIOBySimulation(pNtk2, iMatch2, &iLastItem2, iGroup2, iDep2, oMatch2, &oLastItem2, oGroup2, oDep2, vPiValues2, observability2, topOrder2);
			
			if(ioSuccess1 && ioSuccess2)
				counter = 0;
			else
				counter++;						
			
			if(ioSuccess1 != ioSuccess2 ||
			   !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
			{
				fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");				
				goto freeAndExit;
			}
		}while(counter <= 200);				
		
	}while(0);	

	printf(" done!\n");
	
	simulTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);
	printf("SAT-based search started ...\n");

	satTime = refineBySAT(pNtk1, iMatch1, iGroup1, iDep1, &iLastItem1, oMatch1, oGroup1, oDep1, &oLastItem1, observability1,
		   					   pNtk2, iMatch2, iGroup2, iDep2, &iLastItem2, oMatch2, oGroup2, oDep2, &oLastItem2, observability2);

	printf( "Init Time = %4.2f\n", initTime );	
	printf( "Simulation Time = %4.2f\n", simulTime );
	printf( "SAT Time = %4.2f\n", satTime );
	printf( "Overall Time = %4.2f\n", initTime + simulTime + satTime );
	
freeAndExit:

	for(i = 0; i < iLastItem1 ; i++)
	{			
		
		Vec_IntFree( iMatch1[i] );
		Vec_IntFree( iMatch2[i] );
	}
	
	for(i = 0; i < oLastItem1 ; i++)
	{			
		
		Vec_IntFree( oMatch1[i] );
		Vec_IntFree( oMatch2[i] );
	}

	for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
	{
		Vec_IntFree( iDep1[i] );
		Vec_IntFree( iDep2[i] );
		if(topOrder1 != NULL) {
			Vec_PtrFree( topOrder1[i] );
			Vec_PtrFree( topOrder2[i] );
		}
	}

	for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
	{
		Vec_IntFree( oDep1[i] );
		Vec_IntFree( oDep2[i] );
	}

	ABC_FREE( iMatch1 );
	ABC_FREE( iMatch2 );
	ABC_FREE( oMatch1 );
	ABC_FREE( oMatch2 );
	ABC_FREE( iDep1 );
	ABC_FREE( iDep2 );
	ABC_FREE( oDep1 );
	ABC_FREE( oDep2 );
	ABC_FREE( iGroup1 );
	ABC_FREE( iGroup2 );
	ABC_FREE( oGroup1 );
	ABC_FREE( oGroup2 );	
	ABC_FREE( vPiValues1 );
	ABC_FREE( vPiValues2 );
	ABC_FREE( observability1 );
	ABC_FREE( observability2 );
	if(topOrder1 != NULL) {
		ABC_FREE( topOrder1 );
		ABC_FREE( topOrder2 );
	}
}